

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QList<QString>>>
          (QtPrivate *this,QDebug debug,char *which,QList<QList<QString>_> *c)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  QDebug *pQVar4;
  QList<QString> *pQVar5;
  QList<QString> *vec;
  QDebug debug_00;
  QList<QString> *pQVar6;
  long in_FS_OFFSET;
  undefined1 local_60 [24];
  undefined1 local_48 [8];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar4 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar4,'(');
  pQVar6 = (c->d).ptr;
  lVar2 = (c->d).size;
  pQVar5 = pQVar6 + lVar2;
  if (lVar2 == 0) goto LAB_00595ab8;
  local_60._16_8_ = *(undefined8 *)debug.stream;
  vec = (QList<QString> *)(local_60 + 0x10);
  *(int *)(local_60._16_8_ + 0x28) = *(int *)(local_60._16_8_ + 0x28) + 1;
  debug_00.stream = (Stream *)local_48;
  while( true ) {
    ::operator<<(debug_00,vec);
    QDebug::~QDebug((QDebug *)debug_00.stream);
    QDebug::~QDebug((QDebug *)vec);
    pQVar6 = pQVar6 + 1;
LAB_00595ab8:
    if (pQVar6 == pQVar5) break;
    pQVar4 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60._0_8_ = pQVar4->stream;
    vec = (QList<QString> *)local_60;
    ((Stream *)local_60._0_8_)->ref = ((Stream *)local_60._0_8_)->ref + 1;
    debug_00.stream = (Stream *)(local_60 + 8);
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar3 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar3;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}